

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O2

void event_remove_handler_type(game_event_type type)

{
  event_handler_entry *peVar1;
  event_handler_entry *p;
  
  p = event_handlers[type];
  while (p != (event_handler_entry *)0x0) {
    peVar1 = p->next;
    mem_free(p);
    p = peVar1;
  }
  event_handlers[type] = (event_handler_entry *)0x0;
  return;
}

Assistant:

void event_remove_handler_type(game_event_type type)
{
	struct event_handler_entry *handler = event_handlers[type];

	while (handler) {
		struct event_handler_entry *next = handler->next;
		mem_free(handler);
		handler = next;
	}
	event_handlers[type] = NULL;
}